

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssim.c
# Opt level: O0

uint32_t AccumulateSSE_C(uint8_t *src1,uint8_t *src2,int len)

{
  int32_t diff;
  uint32_t sse2;
  int i;
  int len_local;
  uint8_t *src2_local;
  uint8_t *src1_local;
  
  sse2 = 0;
  for (i = 0; i < len; i = i + 1) {
    sse2 = ((uint)src1[i] - (uint)src2[i]) * ((uint)src1[i] - (uint)src2[i]) + sse2;
  }
  return sse2;
}

Assistant:

static uint32_t AccumulateSSE_C(const uint8_t* src1,
                                const uint8_t* src2, int len) {
  int i;
  uint32_t sse2 = 0;
  assert(len <= 65535);  // to ensure that accumulation fits within uint32_t
  for (i = 0; i < len; ++i) {
    const int32_t diff = src1[i] - src2[i];
    sse2 += diff * diff;
  }
  return sse2;
}